

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,FileDescriptor *file,GeneratorOptions *options,GeneratorContext *context,
          bool use_short_name)

{
  string *psVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *other;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  undefined3 in_register_00000081;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  string filename;
  Printer printer;
  ZeroCopyOutputStream *output;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                 &options->output_dir,"/");
  psVar1 = *(string **)file;
  if (CONCAT31(in_register_00000081,use_short_name) == 0) {
    std::__cxx11::string::string((string *)&annotation_collector,psVar1);
  }
  else {
    std::__cxx11::string::rfind((char)psVar1,0x2f);
    std::__cxx11::string::substr((ulong)&annotation_collector,(ulong)psVar1);
  }
  anon_unknown_0::GetJSFilename((string *)&annotations,options,(string *)&annotation_collector);
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&annotations);
  std::__cxx11::string::~string((string *)&annotations);
  std::__cxx11::string::~string((string *)&annotation_collector);
  std::__cxx11::string::~string((string *)&printer);
  iVar2 = (*context->_vptr_GeneratorContext[2])(context,&filename);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  if (output == (ZeroCopyOutputStream *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&printer,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xe09);
    other = internal::LogMessage::operator<<((LogMessage *)&printer,"CHECK failed: output: ");
    internal::LogFinisher::operator=((LogFinisher *)&annotations,other);
    internal::LogMessage::~LogMessage((LogMessage *)&printer);
  }
  GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
  annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
       (_func_int **)&PTR_AddAnnotation_004d7460;
  annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
  if (options->annotate_code != false) {
    annotation_collector_00 = &annotation_collector;
  }
  annotation_collector.annotation_proto_ = &annotations;
  io::Printer::Printer(&printer,output,'$',&annotation_collector_00->super_AnnotationCollector);
  GenerateFile(this,options,&printer,file);
  if ((printer.failed_ == false) && (options->annotate_code == true)) {
    anon_unknown_0::EmbedCodeAnnotations(&annotations,&printer);
  }
  io::Printer::~Printer(&printer);
  GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  std::__cxx11::string::~string((string *)&filename);
  return (bool)(printer.failed_ ^ 1);
}

Assistant:

bool Generator::GenerateFile(const FileDescriptor* file,
                             const GeneratorOptions& options,
                             GeneratorContext* context,
                             bool use_short_name) const {
  std::string filename =
      options.output_dir + "/" +
      GetJSFilename(options, use_short_name
                                 ? file->name().substr(file->name().rfind('/'))
                                 : file->name());
  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output);
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer printer(output.get(), '$',
                      options.annotate_code ? &annotation_collector : nullptr);

  GenerateFile(options, &printer, file);

  if (printer.failed()) {
    return false;
  }

  if (options.annotate_code) {
    EmbedCodeAnnotations(annotations, &printer);
  }

  return true;
}